

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMemMultipleWritebackInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  MCInst *in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint reglist;
  uint pred;
  uint Rn;
  DecodeStatus S;
  uint64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint Val;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  Val = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x1c,4);
  uVar4 = fieldFromInstruction_4(in_ESI,0,0x10);
  if (uVar3 == 0xf) {
    uVar5 = MCInst_getOpcode(in_RDI);
    if (uVar5 == 0x92) {
      MCInst_setOpcode(in_RDI,0x11e);
    }
    else if (uVar5 == 0x93) {
      MCInst_setOpcode(in_RDI,0x11f);
    }
    else if (uVar5 == 0x94) {
      MCInst_setOpcode(in_RDI,0x120);
    }
    else if (uVar5 == 0x95) {
      MCInst_setOpcode(in_RDI,0x121);
    }
    else if (uVar5 == 0x96) {
      MCInst_setOpcode(in_RDI,0x122);
    }
    else if (uVar5 == 0x98) {
      MCInst_setOpcode(in_RDI,0x123);
    }
    else if (uVar5 == 0x99) {
      MCInst_setOpcode(in_RDI,0x124);
    }
    else if (uVar5 == 0x9a) {
      MCInst_setOpcode(in_RDI,0x125);
    }
    else if (uVar5 == 0x19c) {
      MCInst_setOpcode(in_RDI,0x178);
    }
    else if (uVar5 == 0x19d) {
      MCInst_setOpcode(in_RDI,0x179);
    }
    else if (uVar5 == 0x19e) {
      MCInst_setOpcode(in_RDI,0x17a);
    }
    else if (uVar5 == 0x19f) {
      MCInst_setOpcode(in_RDI,0x17b);
    }
    else if (uVar5 == 0x1a0) {
      MCInst_setOpcode(in_RDI,0x17c);
    }
    else if (uVar5 == 0x1a1) {
      MCInst_setOpcode(in_RDI,0x17d);
    }
    else if (uVar5 == 0x1a2) {
      MCInst_setOpcode(in_RDI,0x17e);
    }
    else {
      if (uVar5 != 0x1a3) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(in_RDI,0x17f);
    }
    uVar3 = fieldFromInstruction_4(in_ESI,0x14,1);
    if (uVar3 == 0) {
      uVar2 = fieldFromInstruction_4(in_ESI,0x16,1);
      if ((uVar2 == 1) && (uVar2 = fieldFromInstruction_4(in_ESI,0x14,1), uVar2 == 0)) {
        uVar2 = fieldFromInstruction_4(in_ESI,0,4);
        MCOperand_CreateImm0(in_RDI,(ulong)uVar2);
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = DecodeRFEInstruction
                          ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),Val,(uint64_t)in_RCX
                           ,(void *)CONCAT44(local_4,uVar2));
    }
  }
  else {
    DVar6 = DecodeGPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar3,uVar4),
                       (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (_Var1) {
      DVar6 = DecodeGPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar3,uVar4),
                         (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
      if (_Var1) {
        DVar6 = DecodePredicateOperand
                          ((MCInst *)CONCAT44(uVar3,uVar4),in_stack_ffffffffffffffc4,
                           in_stack_ffffffffffffffb8,(void *)0x27cd8b);
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
        if (_Var1) {
          DVar6 = DecodeRegListOperand
                            ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),Val,
                             (uint64_t)in_RCX,(void *)CONCAT44(local_4,uVar2));
          _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
          if (!_Var1) {
            local_4 = MCDisassembler_Fail;
          }
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeMemMultipleWritebackInstruction(MCInst *Inst,
		unsigned Insn, uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reglist = fieldFromInstruction_4(Insn, 0, 16);

	if (pred == 0xF) {
		// Ambiguous with RFE and SRS
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDMDA:
				MCInst_setOpcode(Inst, ARM_RFEDA);
				break;
			case ARM_LDMDA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDA_UPD);
				break;
			case ARM_LDMDB:
				MCInst_setOpcode(Inst, ARM_RFEDB);
				break;
			case ARM_LDMDB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDB_UPD);
				break;
			case ARM_LDMIA:
				MCInst_setOpcode(Inst, ARM_RFEIA);
				break;
			case ARM_LDMIA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIA_UPD);
				break;
			case ARM_LDMIB:
				MCInst_setOpcode(Inst, ARM_RFEIB);
				break;
			case ARM_LDMIB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIB_UPD);
				break;
			case ARM_STMDA:
				MCInst_setOpcode(Inst, ARM_SRSDA);
				break;
			case ARM_STMDA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDA_UPD);
				break;
			case ARM_STMDB:
				MCInst_setOpcode(Inst, ARM_SRSDB);
				break;
			case ARM_STMDB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDB_UPD);
				break;
			case ARM_STMIA:
				MCInst_setOpcode(Inst, ARM_SRSIA);
				break;
			case ARM_STMIA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIA_UPD);
				break;
			case ARM_STMIB:
				MCInst_setOpcode(Inst, ARM_SRSIB);
				break;
			case ARM_STMIB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIB_UPD);
				break;
			default:
				return MCDisassembler_Fail;
		}

		// For stores (which become SRS's, the only operand is the mode.
		if (fieldFromInstruction_4(Insn, 20, 1) == 0) {
			// Check SRS encoding constraints
			if (!(fieldFromInstruction_4(Insn, 22, 1) == 1 &&
						fieldFromInstruction_4(Insn, 20, 1) == 0))
				return MCDisassembler_Fail;

			MCOperand_CreateImm0(Inst, fieldFromInstruction_4(Insn, 0, 4));
			return S;
		}

		return DecodeRFEInstruction(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail; // Tied
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeRegListOperand(Inst, reglist, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}